

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.cpp
# Opt level: O0

task_t * __thiscall
jessilib::thread_pool::pop_task(task_t *__return_storage_ptr__,thread_pool *this)

{
  bool bVar1;
  reference __x;
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> guard;
  thread_pool *this_local;
  task_t *task;
  
  guard._M_device = (mutex_type *)this;
  std::lock_guard<std::mutex>::lock_guard(&local_20,&this->m_tasks_mutex);
  bVar1 = std::
          queue<std::function<void_()>,_std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>
          ::empty(&this->m_tasks);
  if (bVar1) {
    std::function<void_()>::function(__return_storage_ptr__,(nullptr_t)0x0);
  }
  else {
    __x = std::
          queue<std::function<void_()>,_std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>
          ::front(&this->m_tasks);
    std::function<void_()>::function(__return_storage_ptr__,__x);
    std::
    queue<std::function<void_()>,_std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>
    ::pop(&this->m_tasks);
  }
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return __return_storage_ptr__;
}

Assistant:

thread_pool::task_t thread_pool::pop_task() {
	std::lock_guard<std::mutex> guard(m_tasks_mutex);
	if (!m_tasks.empty()) {
		task_t task = m_tasks.front();
		m_tasks.pop();
		return task;
	}

	return nullptr;
}